

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerCPP::emit_block_struct(CompilerCPP *this,SPIRType *type)

{
  uint32_t id;
  TypedID<(spirv_cross::Types)1> local_24;
  SPIRType *local_20;
  SPIRType *self;
  SPIRType *type_local;
  CompilerCPP *this_local;
  
  self = type;
  type_local = (SPIRType *)this;
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  local_20 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id);
  TypedID<(spirv_cross::Types)1>::TypedID(&local_24,0);
  (local_20->type_alias).id = local_24.id;
  CompilerGLSL::emit_struct(&this->super_CompilerGLSL,local_20);
  return;
}

Assistant:

void CompilerCPP::emit_block_struct(SPIRType &type)
{
	// C++ can't do interface blocks, so we fake it by emitting a separate struct.
	// However, these structs are not allowed to alias anything, so remove it before
	// emitting the struct.
	//
	// The type we have here needs to be resolved to the non-pointer type so we can remove aliases.
	auto &self = get<SPIRType>(type.self);
	self.type_alias = 0;
	emit_struct(self);
}